

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsluv.c
# Opt level: O0

void luv2lch(Triplet *in_out)

{
  undefined8 uVar1;
  double __x;
  double __y;
  undefined8 *in_RDI;
  double dVar2;
  double c;
  double h;
  double v;
  double u;
  double l;
  double local_28;
  
  uVar1 = *in_RDI;
  __x = (double)in_RDI[1];
  __y = (double)in_RDI[2];
  dVar2 = sqrt(__x * __x + __y * __y);
  if (1e-08 <= dVar2) {
    local_28 = atan2(__y,__x);
    local_28 = local_28 * 57.29577951308232;
    if (local_28 < 0.0) {
      local_28 = local_28 + 360.0;
    }
  }
  else {
    local_28 = 0.0;
  }
  *in_RDI = uVar1;
  in_RDI[1] = dVar2;
  in_RDI[2] = local_28;
  return;
}

Assistant:

static void
luv2lch(Triplet* in_out)
{
    double l = in_out->a;
    double u = in_out->b;
    double v = in_out->c;
    double h;
    double c = sqrt(u * u + v * v);

    /* Grays: disambiguate hue */
    if(c < 0.00000001) {
        h = 0;
    } else {
        h = atan2(v, u) * 57.29577951308232087680;  /* (180 / pi) */
        if(h < 0.0)
            h += 360.0;
    }

    in_out->a = l;
    in_out->b = c;
    in_out->c = h;
}